

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O1

_Bool player_stat_dec(player *p,wchar_t stat,_Bool permanent)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  _Bool _Var7;
  
  sVar6 = p->stat_cur[stat];
  iVar3 = (int)sVar6;
  if (iVar3 < 0x1d) {
    iVar5 = 0x12;
    if (sVar6 < 0x13) {
      iVar5 = iVar3 - (uint)(3 < sVar6);
    }
  }
  else {
    iVar5 = iVar3 + -10;
  }
  sVar6 = p->stat_max[stat];
  _Var7 = iVar5 != iVar3;
  if (permanent) {
    iVar3 = (int)sVar6;
    if (sVar6 < 0x1d) {
      iVar4 = 0x12;
      if (sVar6 < 0x13) {
        iVar4 = iVar3 - (uint)(3 < sVar6);
      }
    }
    else {
      iVar4 = iVar3 + -10;
    }
    _Var7 = iVar4 != iVar3;
    sVar6 = (short)iVar4;
  }
  if (_Var7 != false) {
    p->stat_cur[stat] = (int16_t)iVar5;
    p->stat_max[stat] = sVar6;
    ppVar2 = p->upkeep;
    puVar1 = &ppVar2->update;
    *puVar1 = *puVar1 | 1;
    puVar1 = &ppVar2->redraw;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  }
  return _Var7;
}

Assistant:

bool player_stat_dec(struct player *p, int stat, bool permanent)
{
	int cur, max, res = false;

	cur = p->stat_cur[stat];
	max = p->stat_max[stat];

	if (cur > 18+10)
		cur -= 10;
	else if (cur > 18)
		cur = 18;
	else if (cur > 3)
		cur -= 1;

	res = (cur != p->stat_cur[stat]);

	if (permanent) {
		if (max > 18+10)
			max -= 10;
		else if (max > 18)
			max = 18;
		else if (max > 3)
			max -= 1;

		res = (max != p->stat_max[stat]);
	}

	if (res) {
		p->stat_cur[stat] = cur;
		p->stat_max[stat] = max;
		p->upkeep->update |= (PU_BONUS);
		p->upkeep->redraw |= (PR_STATS);
	}

	return res;
}